

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::setQPDFOptions(QPDFJob *this,QPDF *pdf)

{
  element_type *peVar1;
  shared_ptr<QPDFLogger> local_28;
  QPDF *local_18;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  local_18 = pdf;
  pdf_local = (QPDF *)this;
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<QPDFLogger>::shared_ptr(&local_28,&peVar1->log);
  QPDF::setLogger(pdf,&local_28);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_28);
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar1->ignore_xref_streams & 1U) != 0) {
    QPDF::setIgnoreXRefStreams(local_18,true);
  }
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar1->suppress_recovery & 1U) != 0) {
    QPDF::setAttemptRecovery(local_18,false);
  }
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar1->password_is_hex_key & 1U) != 0) {
    QPDF::setPasswordIsHexKey(local_18,true);
  }
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar1->suppress_warnings & 1U) != 0) {
    QPDF::setSuppressWarnings(local_18,true);
  }
  return;
}

Assistant:

void
QPDFJob::setQPDFOptions(QPDF& pdf)
{
    pdf.setLogger(m->log);
    if (m->ignore_xref_streams) {
        pdf.setIgnoreXRefStreams(true);
    }
    if (m->suppress_recovery) {
        pdf.setAttemptRecovery(false);
    }
    if (m->password_is_hex_key) {
        pdf.setPasswordIsHexKey(true);
    }
    if (m->suppress_warnings) {
        pdf.setSuppressWarnings(true);
    }
}